

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall libcellml::Annotator::AnnotatorImpl::doSetImportSourceIds(AnnotatorImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_type this_00;
  size_type sVar3;
  int iVar4;
  AnyCellmlElementPtr *item;
  AnyCellmlElementPtr *importSource;
  bool bVar5;
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  importSources;
  AnyCellmlElementPtr entry;
  string id;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>
  local_c8;
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  local_90;
  undefined1 local_78 [40];
  pointer local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>>
  *local_38;
  
  local_c8.first._M_string_length =
       (size_type)
       (this->mModel).super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.first._M_string_length ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001d5d76:
    local_c8.first._M_dataplus._M_p = (pointer)0x0;
    local_c8.first._M_string_length = 0;
    bVar5 = true;
  }
  else {
    iVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.first._M_string_length)->
            _M_use_count;
    do {
      if (iVar4 == 0) goto LAB_001d5d76;
      LOCK();
      iVar2 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.first._M_string_length)->
              _M_use_count;
      bVar5 = iVar4 == iVar2;
      if (bVar5) {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.first._M_string_length)->
        _M_use_count = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar5);
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.first._M_string_length)->
        _M_use_count == 0) {
      local_c8.first._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      local_c8.first._M_dataplus._M_p =
           (pointer)(this->mModel).super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.first._M_string_length)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.first._M_string_length)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.first._M_string_length)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.first._M_string_length)->_M_use_count + 1;
    }
    bVar5 = false;
  }
  this_00 = local_c8.first._M_string_length;
  getAllImportSources(&local_90,(ModelConstPtr *)&local_c8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.first._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.first._M_string_length);
  }
  if (local_90.
      super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_c8.first.field_2;
    local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>>
                *)&this->mIdList;
    importSource = (AnyCellmlElementPtr *)
                   local_90.
                   super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    do {
      Entity::id_abi_cxx11_
                (&local_c8.first,
                 (Entity *)
                 (importSource->
                 super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      sVar3 = local_c8.first._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.first._M_dataplus._M_p,
                        local_c8.first.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3 ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        makeUniqueId_abi_cxx11_((string *)(local_78 + 0x20),this);
        Entity::setId((Entity *)
                      (importSource->
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,(string *)(local_78 + 0x20));
        AnyCellmlElement::AnyCellmlElementImpl::create();
        item = importSource;
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  (*(AnyCellmlElementImpl **)local_78._16_8_,(ImportSourcePtr *)importSource);
        convertToWeak((AnnotatorImpl *)local_78,item);
        local_c8.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_78._32_8_,(long)local_50 + local_78._32_8_);
        local_c8.second.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_78._0_8_;
        local_c8.second.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
        local_78._0_8_ = (element_type *)0x0;
        local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>>
        ::
        _M_emplace_equal<std::pair<std::__cxx11::string,std::shared_ptr<libcellml::AnyCellmlElement>>>
                  (local_38,&local_c8);
        if (local_c8.second.
            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.second.
                     super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8.first._M_dataplus._M_p,
                          local_c8.first.field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._32_8_ != &local_48) {
          operator_delete((void *)local_78._32_8_,local_48._M_allocated_capacity + 1);
        }
      }
      importSource = importSource + 1;
    } while (importSource !=
             (AnyCellmlElementPtr *)
             local_90.
             super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  ::~vector(&local_90);
  if (!bVar5) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  return;
}

Assistant:

void Annotator::AnnotatorImpl::doSetImportSourceIds()
{
    // Import items.
    auto model = mModel.lock();
    auto importSources = getAllImportSources(model);
    for (auto &importSource : importSources) {
        if (importSource->id().empty()) {
            auto id = makeUniqueId();
            importSource->setId(id);
            auto entry = AnyCellmlElement::AnyCellmlElementImpl::create();
            entry->mPimpl->setImportSource(importSource);
            mIdList.insert(std::make_pair(id, convertToWeak(entry)));
        }
    }
}